

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

void __thiscall
glu::sl::ShaderParser::parseShaderCase
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  string *__rhs;
  Token TVar1;
  ShaderCaseFactory *pSVar2;
  pointer pbVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pbVar7;
  pointer pRVar8;
  pointer pbVar9;
  pointer pbVar10;
  pointer pbVar11;
  pointer pbVar12;
  pointer pbVar13;
  pointer pbVar14;
  pointer pbVar15;
  pointer pbVar16;
  pointer pbVar17;
  pointer pbVar18;
  pointer pRVar19;
  pointer pRVar20;
  ExpectResult EVar21;
  GLSLVersion GVar22;
  vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *this_00;
  pointer pPVar23;
  pointer pPVar24;
  pointer pPVar25;
  int iVar26;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 extraout_RAX;
  ShaderParser *pSVar27;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  size_t reqNdx;
  ulong uVar28;
  long lVar29;
  undefined1 uVar30;
  ExpectResult expectResult;
  GLSLVersion version;
  uint local_39c;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_> local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_338;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_318;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f8;
  vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> local_2d8;
  vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_> requiredCaps;
  vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_> requirements;
  TestNode *local_260;
  string bothSource;
  string description;
  undefined1 local_218 [144];
  CaseRequirement requirement;
  ValueBlock local_158;
  vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
  avStack_110 [2];
  pointer local_d8;
  undefined1 uStack_d0;
  undefined7 uStack_cf;
  undefined1 uStack_c8;
  undefined8 uStack_c7;
  pointer pRStack_b8;
  undefined4 uStack_b0;
  undefined4 local_ac;
  undefined4 uStack_a8;
  undefined8 uStack_a4;
  string caseName;
  ValueBlock valueBlock;
  
  local_2c0 = (vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList;
  advanceToken(this,TOKEN_CASE);
  __rhs = &this->m_curTokenStr;
  std::__cxx11::string::string((string *)&caseName,(string *)__rhs);
  advanceToken(this);
  version = GLSL_VERSION_100_ES;
  expectResult = EXPECT_PASS;
  description._M_dataplus._M_p = (pointer)&description.field_2;
  description._M_string_length = 0;
  description.field_2._M_local_buf[0] = '\0';
  bothSource._M_dataplus._M_p = (pointer)&bothSource.field_2;
  bothSource._M_string_length = 0;
  local_39c = 0;
  bothSource.field_2._M_local_buf[0] = '\0';
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_318.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_338.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_358.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valueBlock.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valueBlock.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valueBlock.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valueBlock.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valueBlock.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  valueBlock.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valueBlock.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  valueBlock.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  valueBlock.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  requirements.
  super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  requirements.
  super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  requirements.
  super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_398.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_398.
  super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
LAB_008e3a38:
  do {
    TVar1 = this->m_curToken;
    switch(TVar1) {
    case TOKEN_VERSION:
      advanceToken(this);
      parseGLSLVersion(this,&version);
      break;
    case TOKEN_TESSELLATION_CONTROL:
    case TOKEN_TESSELLATION_EVALUATION:
    case TOKEN_GEOMETRY:
switchD_008e3a4a_caseD_2f:
      requirement._0_8_ =
           &requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
           (uint)requirement.extension.alternatives.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
      advanceToken(this);
      pSVar27 = (ShaderParser *)0x3;
      assumeToken(this,TOKEN_SHADER_SOURCE);
      parseShaderSource_abi_cxx11_((string *)local_218,pSVar27,(__rhs->_M_dataplus)._M_p);
      std::__cxx11::string::operator=((string *)&requirement,(string *)local_218);
      std::__cxx11::string::~string((string *)local_218);
      advanceToken(this);
      if (TVar1 == TOKEN_BOTH) {
        if (bothSource._M_string_length != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_218,"multiple \'both\' blocks",(allocator<char> *)&local_2b8);
          parseError(this,(string *)local_218);
LAB_008e4497:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_218,(char *)0x0,(allocator<char> *)&local_2b8);
          parseError(this,(string *)local_218);
          goto switchD_008e3a4a_caseD_33;
        }
        std::__cxx11::string::_M_assign((string *)&bothSource);
      }
      else {
        this_01 = &local_2f8;
        if (TVar1 != TOKEN_VERTEX) {
          if (TVar1 == TOKEN_FRAGMENT) {
            this_01 = &local_318;
          }
          else if (TVar1 == TOKEN_TESSELLATION_CONTROL) {
            this_01 = &local_338;
          }
          else if (TVar1 == TOKEN_TESSELLATION_EVALUATION) {
            this_01 = &local_358;
          }
          else {
            if (TVar1 != TOKEN_GEOMETRY) goto LAB_008e4497;
            this_01 = &local_378;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(this_01,(value_type *)&requirement);
      }
      std::__cxx11::string::~string((string *)&requirement);
      break;
    case TOKEN_REQUIRE:
      requirement.type = TYPE_LAST;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      requirement.extension.effectiveStages = 0;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
      requirement.extension.alternatives.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
      requirement.requiredCap.enumName = 0;
      requirement.requiredCap.referenceValue = 0;
      parseRequirement(this,&requirement);
      std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::push_back
                (&requirements,(value_type *)&requirement);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&requirement.extension.alternatives);
      break;
    case TOKEN_IN:
    case TOKEN_IMPORT:
switchD_008e3a4a_caseD_33:
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &requirement,"unexpected token while parsing shader case: ",__rhs);
      parseError(this,(string *)&requirement);
LAB_008e44e5:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requirement,"\'both\' cannot be mixed with other shader stages",
                 (allocator<char> *)local_218);
      parseError(this,(string *)&requirement);
LAB_008e4511:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requirement,"pipeline programs cannot be mixed with complete programs",
                 (allocator<char> *)local_218);
      parseError(this,(string *)&requirement);
LAB_008e453d:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requirement,"multiple value blocks",(allocator<char> *)local_218);
      parseError(this,(string *)&requirement);
LAB_008e4569:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&requirement,
                 "global extension requirements cannot be mixed with pipeline programs",
                 (allocator<char> *)local_218);
      parseError(this,(string *)&requirement);
      std::__cxx11::string::~string((string *)&requirement);
      std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::~vector
                (&local_2d8);
      std::_Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
      ~_Vector_base(&requiredCaps.
                     super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                   );
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      ~vector(&local_398);
      std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::~vector
                (&requirements);
      ValueBlock::~ValueBlock(&valueBlock);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_378);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_358);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_338);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_318);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_2f8);
      std::__cxx11::string::~string((string *)&bothSource);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&caseName);
      _Unwind_Resume(extraout_RAX);
    case TOKEN_PIPELINE_PROGRAM:
      memset((ProgramSpecification *)&requirement,0,0xac);
      local_d8 = (pointer)0x0;
      uStack_d0 = 0;
      uStack_cf = 0;
      uStack_c8 = 0;
      uStack_c7 = 0;
      uStack_a8 = 0;
      uStack_a4 = 0;
      pRStack_b8 = (pointer)0x0;
      uStack_b0 = 0;
      local_ac = 0;
      parsePipelineProgram(this,(ProgramSpecification *)&requirement);
      uStack_c7._7_1_ = true;
      std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
      push_back(&local_398,(ProgramSpecification *)&requirement);
      ProgramSpecification::~ProgramSpecification((ProgramSpecification *)&requirement);
      break;
    default:
      if (8 < TVar1 - TOKEN_DESC) goto switchD_008e3a4a_caseD_33;
      switch(TVar1) {
      case TOKEN_DESC:
        advanceToken(this);
        pSVar27 = (ShaderParser *)0x2;
        assumeToken(this,TOKEN_STRING);
        parseStringLiteral_abi_cxx11_((string *)&requirement,pSVar27,(__rhs->_M_dataplus)._M_p);
        std::__cxx11::string::operator=((string *)&description,(string *)&requirement);
        std::__cxx11::string::~string((string *)&requirement);
        advanceToken(this);
        break;
      case TOKEN_EXPECT:
        advanceToken(this);
        parseExpectResult(this,&expectResult);
        break;
      case TOKEN_GROUP:
      case TOKEN_CASE:
        goto switchD_008e3a4a_caseD_33;
      case TOKEN_END:
        advanceToken(this,TOKEN_END);
        requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        requiredCaps.
        super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_2d8.
        super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_2d8.
        super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_2d8.
        super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        lVar29 = 0x28;
        uVar30 = 0;
        for (uVar28 = 0; this_00 = local_2c0, GVar22 = version, EVar21 = expectResult,
            uVar28 < (ulong)(((long)requirements.
                                    super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)requirements.
                                   super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                   ._M_impl.super__Vector_impl_data._M_start) / 0x30);
            uVar28 = uVar28 + 1) {
          iVar26 = *(int *)((long)requirements.
                                  super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x28);
          if (iVar26 == 2) {
            std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            push_back(&requiredCaps,
                      (value_type *)
                      ((long)&(requirements.
                               super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                               ._M_impl.super__Vector_impl_data._M_start)->type + lVar29));
          }
          else if (iVar26 == 1) {
            uVar30 = 1;
          }
          else if (iVar26 == 0) {
            std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
            push_back(&local_2d8,
                      (value_type *)
                      ((long)requirements.
                             super__Vector_base<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar29 + -0x20));
          }
          lVar29 = lVar29 + 0x30;
        }
        if (bothSource._M_string_length != 0) {
          if (((local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_2f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) &&
              (local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) &&
             ((local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish &&
              (((local_358.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_358.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish &&
                (local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start ==
                 local_378.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) &&
               (local_398.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_398.
                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                ._M_impl.super__Vector_impl_data._M_finish)))))) {
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            requirement.extension.effectiveStages = 0;
            requirement.extension._28_4_ = 0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requirement._4_4_ = expectResult;
            requirement.type = TYPE_FULL_GLSL_ES_100_SUPPORT;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(requirement.extension.alternatives.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,version);
            requirement.requiredCap.enumName._0_1_ = uVar30;
            std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       *)&requirement.extension.alternatives.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&requiredCaps);
            ValueBlock::operator=(&local_158,&valueBlock);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(avStack_110,1);
            pPVar23 = avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            VertexSource::VertexSource((VertexSource *)local_218,&bothSource);
            ProgramSources::operator<<(&pPVar23->sources,(ShaderSource *)local_218);
            std::__cxx11::string::~string((string *)(local_218 + 8));
            std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
            operator=(&(avStack_110[0].
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,&local_2d8);
            pSVar2 = this->m_caseFactory;
            std::operator+(&local_2b8,&caseName,"_vertex");
            ShaderCaseSpecification::ShaderCaseSpecification
                      ((ShaderCaseSpecification *)local_218,(ShaderCaseSpecification *)&requirement)
            ;
            iVar26 = (*pSVar2->_vptr_ShaderCaseFactory[1])(pSVar2,&local_2b8,&description,local_218)
            ;
            local_260 = (TestNode *)CONCAT44(extraout_var,iVar26);
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      (this_00,&local_260);
            ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_218);
            std::__cxx11::string::~string((string *)&local_2b8);
            ShaderCaseSpecification::~ShaderCaseSpecification
                      ((ShaderCaseSpecification *)&requirement);
            requirement.extension.effectiveStages = 0;
            requirement.extension._28_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            requirement._4_4_ = EVar21;
            requirement.type = TYPE_IMPLEMENTATION_LIMIT;
            requirement.extension.alternatives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)CONCAT44(requirement.extension.alternatives.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start._4_4_,GVar22);
            std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
            operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       *)&requirement.extension.alternatives.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&requiredCaps);
            ValueBlock::operator=(&local_158,&valueBlock);
            std::
            vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>::
            resize(avStack_110,1);
            pPVar23 = avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            FragmentSource::FragmentSource((FragmentSource *)local_218,&bothSource);
            ProgramSources::operator<<(&pPVar23->sources,(ShaderSource *)local_218);
            std::__cxx11::string::~string((string *)(local_218 + 8));
            std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
            operator=(&(avStack_110[0].
                        super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                        ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions,&local_2d8);
            pSVar2 = this->m_caseFactory;
            std::operator+(&local_2b8,&caseName,"_fragment");
            ShaderCaseSpecification::ShaderCaseSpecification
                      ((ShaderCaseSpecification *)local_218,(ShaderCaseSpecification *)&requirement)
            ;
            iVar26 = (*pSVar2->_vptr_ShaderCaseFactory[1])(pSVar2,&local_2b8,&description,local_218)
            ;
            local_260 = (TestNode *)CONCAT44(extraout_var_00,iVar26);
            std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                      (this_00,&local_260);
            ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_218);
            std::__cxx11::string::~string((string *)&local_2b8);
            goto LAB_008e43af;
          }
          goto LAB_008e44e5;
        }
        if (local_398.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_398.
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          requirement.extension.effectiveStages = 0;
          requirement.extension._28_4_ = 0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requirement._0_8_ = (ulong)expectResult << 0x20;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(requirement.extension.alternatives.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,version);
          requirement.requiredCap.enumName._0_1_ = uVar30;
          std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
          operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                     *)&requirement.extension.alternatives.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&requiredCaps);
          ValueBlock::operator=(&local_158,&valueBlock);
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::resize(avStack_110,1);
          pbVar3 = ((avStack_110[0].
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar9 = ((avStack_110[0].
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pbVar10 = ((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar4 = *(pointer *)
                    ((long)(&((avStack_110[0].
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 1) + 0x10);
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 1) + 0x10) =
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar11 = *(pointer *)
                     (&((avStack_110[0].
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 1);
          pbVar12 = *(pointer *)
                     ((long)(&((avStack_110[0].
                                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 1) + 8);
          *(pointer *)
           (&((avStack_110[0].
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 1) = local_318.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 1) + 8) =
               local_318.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar5 = *(pointer *)
                    ((long)(&((avStack_110[0].
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 3) + 0x10);
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 3) + 0x10) =
               local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar13 = *(pointer *)
                     (&((avStack_110[0].
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 3);
          pbVar14 = *(pointer *)
                     ((long)(&((avStack_110[0].
                                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 3) + 8);
          *(pointer *)
           (&((avStack_110[0].
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 3) = local_338.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 3) + 8) =
               local_338.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar6 = *(pointer *)
                    ((long)(&((avStack_110[0].
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 4) + 0x10);
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 4) + 0x10) =
               local_358.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar15 = *(pointer *)
                     (&((avStack_110[0].
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 4);
          pbVar16 = *(pointer *)
                     ((long)(&((avStack_110[0].
                                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 4) + 8);
          *(pointer *)
           (&((avStack_110[0].
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 4) = local_358.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 4) + 8) =
               local_358.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pbVar7 = *(pointer *)
                    ((long)(&((avStack_110[0].
                               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           + 2) + 0x10);
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 2) + 0x10) =
               local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pbVar17 = *(pointer *)
                     (&((avStack_110[0].
                         super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                         ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     + 2);
          pbVar18 = *(pointer *)
                     ((long)(&((avStack_110[0].
                                super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                                ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            + 2) + 8);
          *(pointer *)
           (&((avStack_110[0].
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           + 2) = local_378.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)(&((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->sources).sources[0].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  + 2) + 8) =
               local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pRVar8 = ((avStack_110[0].
                     super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                     ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                   super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_2d8.
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pRVar19 = ((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                    super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pRVar20 = ((avStack_110[0].
                      super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                      ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
                    super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_2d8.
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               ._M_impl.super__Vector_impl_data._M_start;
          ((avStack_110[0].
            super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
            ._M_impl.super__Vector_impl_data._M_start)->requiredExtensions).
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2d8.
               super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          pSVar2 = this->m_caseFactory;
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar17;
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar18;
          local_378.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar7;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar15;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar16;
          local_358.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar6;
          local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar13;
          local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar14;
          local_338.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar5;
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar11;
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
          local_318.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar4;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = pbVar9;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar10;
          local_2f8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar3;
          local_2d8.
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_start = pRVar19;
          local_2d8.
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_finish = pRVar20;
          local_2d8.
          super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8;
          ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_218,(ShaderCaseSpecification *)&requirement);
          iVar26 = (*pSVar2->_vptr_ShaderCaseFactory[1])(pSVar2,&caseName,&description,local_218);
          local_2b8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_02,iVar26);
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    (this_00,(TestNode **)&local_2b8);
LAB_008e43a2:
          ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)local_218);
LAB_008e43af:
          ShaderCaseSpecification::~ShaderCaseSpecification((ShaderCaseSpecification *)&requirement)
          ;
          std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
          ~vector(&local_2d8);
          std::
          _Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
          ~_Vector_base(&requiredCaps.
                         super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                       );
          std::vector<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ::~vector(&local_398);
          std::vector<glu::sl::CaseRequirement,_std::allocator<glu::sl::CaseRequirement>_>::~vector
                    (&requirements);
          ValueBlock::~ValueBlock(&valueBlock);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_378);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_358);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_338);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_318);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_2f8);
          std::__cxx11::string::~string((string *)&bothSource);
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&caseName);
          return;
        }
        if ((((local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               local_2f8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_318.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish)) &&
            (local_338.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_338.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           ((local_358.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_358.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish &&
            (local_378.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_378.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)))) {
          if (local_2d8.
              super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              local_2d8.
              super__Vector_base<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>
              ._M_impl.super__Vector_impl_data._M_finish) goto LAB_008e4569;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          requirement.extension.effectiveStages = 0;
          requirement.extension._28_4_ = 0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.inputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.outputs.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_158.uniforms.super__Vector_base<glu::sl::Value,_std::allocator<glu::sl::Value>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          requirement._0_8_ = (ulong)expectResult << 0x20;
          requirement.extension.alternatives.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(requirement.extension.alternatives.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,version);
          requirement.requiredCap.enumName._0_1_ = uVar30;
          std::vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>::
          operator=((vector<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                     *)&requirement.extension.alternatives.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,&requiredCaps);
          ValueBlock::operator=(&local_158,&valueBlock);
          pPVar25 = avStack_110[0].
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          pPVar24 = avStack_110[0].
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pPVar23 = avStack_110[0].
                    super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_398.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_398.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_start;
          avStack_110[0].
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_398.
               super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_398.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_start = pPVar23;
          local_398.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_finish = pPVar24;
          local_398.
          super__Vector_base<glu::sl::ProgramSpecification,_std::allocator<glu::sl::ProgramSpecification>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar25;
          pSVar2 = this->m_caseFactory;
          ShaderCaseSpecification::ShaderCaseSpecification
                    ((ShaderCaseSpecification *)local_218,(ShaderCaseSpecification *)&requirement);
          iVar26 = (*pSVar2->_vptr_ShaderCaseFactory[1])(pSVar2,&caseName,&description,local_218);
          local_2b8._M_dataplus._M_p = (pointer)CONCAT44(extraout_var_01,iVar26);
          std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
                    (this_00,(TestNode **)&local_2b8);
          goto LAB_008e43a2;
        }
        goto LAB_008e4511;
      case TOKEN_VALUES:
        if ((local_39c & 1) == 0) goto code_r0x008e3c7a;
        goto LAB_008e453d;
      default:
        goto switchD_008e3a4a_caseD_2f;
      }
    }
  } while( true );
code_r0x008e3c7a:
  local_39c = (uint)CONCAT71((int7)((ulong)((long)&switchD_008e3a7d::switchdataD_00a25004 +
                                           (long)(int)(&switchD_008e3a7d::switchdataD_00a25004)
                                                      [TVar1 - TOKEN_DESC]) >> 8),1);
  parseValueBlock(this,&valueBlock);
  goto LAB_008e3a38;
}

Assistant:

void ShaderParser::parseShaderCase (vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderCase()\n"));
	advanceToken(TOKEN_CASE);

	// Parse case name.
	string caseName = m_curTokenStr;
	advanceToken(); // \note [pyry] All token types are allowed here.

	// \todo [pyry] Optimize by parsing most stuff directly to ShaderCaseSpecification

	// Setup case.
	GLSLVersion						version			= DEFAULT_GLSL_VERSION;
	ExpectResult					expectResult	= EXPECT_PASS;
	string							description;
	string							bothSource;
	vector<string>					vertexSources;
	vector<string>					fragmentSources;
	vector<string>					tessellationCtrlSources;
	vector<string>					tessellationEvalSources;
	vector<string>					geometrySources;
	ValueBlock						valueBlock;
	bool							valueBlockSeen	= false;
	vector<CaseRequirement>			requirements;
	vector<ProgramSpecification>	pipelinePrograms;

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_DESC)
		{
			advanceToken();
			assumeToken(TOKEN_STRING);
			description = parseStringLiteral(m_curTokenStr.c_str());
			advanceToken();
		}
		else if (m_curToken == TOKEN_EXPECT)
		{
			advanceToken();
			parseExpectResult(expectResult);
		}
		else if (m_curToken == TOKEN_VALUES)
		{
			if (valueBlockSeen)
				parseError("multiple value blocks");
			parseValueBlock(valueBlock);
			valueBlockSeen = true;
		}
		else if (m_curToken == TOKEN_BOTH						||
				 m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					vertexSources.push_back(source);			break;
				case TOKEN_FRAGMENT:				fragmentSources.push_back(source);			break;
				case TOKEN_TESSELLATION_CONTROL:	tessellationCtrlSources.push_back(source);	break;
				case TOKEN_TESSELLATION_EVALUATION:	tessellationEvalSources.push_back(source);	break;
				case TOKEN_GEOMETRY:				geometrySources.push_back(source);			break;
				case TOKEN_BOTH:
				{
					if (!bothSource.empty())
						parseError("multiple 'both' blocks");
					bothSource = source;
					break;
				}

				default:
					parseError(DE_FALSE);
			}
		}
		else if (m_curToken == TOKEN_VERSION)
		{
			advanceToken();
			parseGLSLVersion(version);
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);
			requirements.push_back(requirement);
		}
		else if (m_curToken == TOKEN_PIPELINE_PROGRAM)
		{
			ProgramSpecification pipelineProgram;
			parsePipelineProgram(pipelineProgram);
			pipelineProgram.sources.separable = true;
			pipelinePrograms.push_back(pipelineProgram);
		}
		else
			parseError(string("unexpected token while parsing shader case: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // case end

	// \todo [pyry] Clean up
	vector<RequiredCapability>	requiredCaps;
	vector<RequiredExtension>	requiredExts;
	bool						fullGLSLES100Required	= false;

	for (size_t reqNdx = 0; reqNdx < requirements.size(); ++reqNdx)
	{
		const CaseRequirement&	requirement	= requirements[reqNdx];

		if (requirement.type == CaseRequirement::TYPE_EXTENSION)
			requiredExts.push_back(requirement.extension);
		else if (requirement.type == CaseRequirement::TYPE_IMPLEMENTATION_LIMIT)
			requiredCaps.push_back(requirement.requiredCap);
		else if (requirement.type == CaseRequirement::TYPE_FULL_GLSL_ES_100_SUPPORT)
			fullGLSLES100Required = true;
		else
			DE_ASSERT(false);
	}

	if (!bothSource.empty())
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty()			||
			!pipelinePrograms.empty())
		{
			parseError("'both' cannot be mixed with other shader stages");
		}

		// vertex
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_VERTEX_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << VertexSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_vertex", description, ShaderCaseSpecification(spec)));
		}

		// fragment
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_FRAGMENT_ONLY;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.resize(1);
			spec.programs[0].sources << FragmentSource(bothSource);
			spec.programs[0].requiredExtensions	= requiredExts;

			shaderNodeList.push_back(m_caseFactory->createCase(caseName + "_fragment", description, ShaderCaseSpecification(spec)));
		}
	}
	else if (pipelinePrograms.empty())
	{
		ShaderCaseSpecification	spec;
		spec.caseType				= CASETYPE_COMPLETE;
		spec.expectResult			= expectResult;
		spec.targetVersion			= version;
		spec.fullGLSLES100Required	= fullGLSLES100Required;
		spec.requiredCaps			= requiredCaps;
		spec.values					= valueBlock;

		spec.programs.resize(1);
		spec.programs[0].sources.sources[SHADERTYPE_VERTEX].swap(vertexSources);
		spec.programs[0].sources.sources[SHADERTYPE_FRAGMENT].swap(fragmentSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_CONTROL].swap(tessellationCtrlSources);
		spec.programs[0].sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].swap(tessellationEvalSources);
		spec.programs[0].sources.sources[SHADERTYPE_GEOMETRY].swap(geometrySources);
		spec.programs[0].requiredExtensions.swap(requiredExts);

		shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
	}
	else
	{
		if (!vertexSources.empty()				||
			!fragmentSources.empty()			||
			!tessellationCtrlSources.empty()	||
			!tessellationEvalSources.empty()	||
			!geometrySources.empty())
		{
			parseError("pipeline programs cannot be mixed with complete programs");
		}

		if (!requiredExts.empty())
			parseError("global extension requirements cannot be mixed with pipeline programs");

		// Pipeline case, multiple programs
		{
			ShaderCaseSpecification	spec;
			spec.caseType				= CASETYPE_COMPLETE;
			spec.expectResult			= expectResult;
			spec.targetVersion			= version;
			spec.fullGLSLES100Required	= fullGLSLES100Required;
			spec.requiredCaps			= requiredCaps;
			spec.values					= valueBlock;

			spec.programs.swap(pipelinePrograms);

			shaderNodeList.push_back(m_caseFactory->createCase(caseName, description, ShaderCaseSpecification(spec)));
		}
	}
}